

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.h
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::InsertVariables(ChSystemDescriptor *this,ChVariables *mv)

{
  pointer *pppCVar1;
  iterator __position;
  ChVariables *local_8;
  
  __position._M_current =
       (this->vvariables).
       super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->vvariables).
      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = mv;
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*const&>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)
               &this->vvariables,__position,&local_8);
  }
  else {
    *__position._M_current = mv;
    pppCVar1 = &(this->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

virtual void InsertVariables(ChVariables* mv) { vvariables.push_back(mv); }